

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O3

ps_lattice_t * fsg_search_lattice(ps_search_t *search)

{
  uint *puVar1;
  gnode_s **ppgVar2;
  float fVar3;
  fsg_model_t *fsg;
  void *ptr;
  logmath_t *plVar4;
  int32 iVar5;
  s3wid_t sVar6;
  ps_lattice_t *ppVar7;
  fsg_hist_entry_t *pfVar8;
  fsg_hist_entry_t *pfVar9;
  fsg_arciter_t *itor;
  fsg_link_t *pfVar10;
  fsg_arciter_t *itor_00;
  glist_t pgVar11;
  ps_latnode_t *ppVar12;
  ps_latnode_t *ppVar13;
  gnode_t *gn;
  int32 ef;
  int iVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  dict_t *d;
  char *pcVar18;
  int32 node_id;
  char *pcVar19;
  int iVar20;
  gnode_s *pgVar21;
  int32 id;
  undefined8 *puVar22;
  double dVar23;
  undefined8 in_stack_ffffffffffffffa8;
  ps_search_t *ppVar24;
  int32 local_4c;
  
  ppVar7 = search->dag;
  if ((ppVar7 != (ps_lattice_t *)0x0) && (ppVar7->n_frames == search[1].post)) {
    return ppVar7;
  }
  ps_lattice_free(ppVar7);
  search->dag = (ps_lattice_t *)0x0;
  ppVar7 = ps_lattice_init_search(search,search[1].post);
  fsg = (fsg_model_t *)search[1].type;
  iVar5 = fsg_history_n_entries((fsg_history_t *)search[1].pls);
  if (0 < iVar5) {
    id = 0;
    do {
      pfVar8 = fsg_history_entry_get((fsg_history_t *)search[1].pls,id);
      pfVar10 = pfVar8->fsglink;
      if ((pfVar10 != (fsg_link_t *)0x0) && (ef = pfVar10->wid, ef != -1)) {
        if (pfVar8->pred == 0) {
          node_id = pfVar8->score;
          uVar16 = 0;
        }
        else {
          pfVar9 = fsg_history_entry_get((fsg_history_t *)search[1].pls,pfVar8->pred);
          node_id = pfVar8->score - pfVar9->score;
          uVar16 = pfVar9->frame + 1;
          pfVar10 = pfVar8->fsglink;
          ef = pfVar10->wid;
        }
        new_node(ppVar7,(fsg_model_t *)(ulong)uVar16,pfVar8->frame,ef,pfVar10->to_state,node_id,
                 (int32)in_stack_ffffffffffffffa8);
      }
      id = id + 1;
    } while (iVar5 != id);
  }
  iVar5 = fsg_history_n_entries((fsg_history_t *)search[1].pls);
  if (0 < iVar5) {
    iVar17 = 0;
    do {
      pfVar8 = fsg_history_entry_get((fsg_history_t *)search[1].pls,iVar17);
      pfVar10 = pfVar8->fsglink;
      if ((pfVar10 != (fsg_link_t *)0x0) && (iVar20 = pfVar10->wid, iVar20 != -1)) {
        if (pfVar8->pred == 0) {
          local_4c = pfVar8->score;
          iVar14 = 0;
        }
        else {
          pfVar9 = fsg_history_entry_get((fsg_history_t *)search[1].pls,pfVar8->pred);
          iVar14 = pfVar9->frame + 1;
          local_4c = pfVar8->score - pfVar9->score;
          pfVar10 = pfVar8->fsglink;
          iVar20 = pfVar10->wid;
        }
        for (ppVar13 = ppVar7->nodes; ppVar13 != (ps_latnode_t *)0x0; ppVar13 = ppVar13->next) {
          if (((ppVar13->sf == iVar14) && (ppVar13->wid == iVar20)) &&
             (ppVar13->node_id == pfVar10->to_state)) goto LAB_0012a4bd;
        }
        ppVar13 = (ps_latnode_t *)0x0;
LAB_0012a4bd:
        iVar20 = pfVar8->frame;
        itor = fsg_model_arcs(fsg,pfVar10->to_state);
        if (itor != (fsg_arciter_t *)0x0) {
          iVar20 = iVar20 + 1;
          do {
            pfVar10 = fsg_arciter_get(itor);
            if (pfVar10->wid < 0) {
              for (itor_00 = fsg_model_arcs(fsg,pfVar10->to_state); itor_00 != (fsg_arciter_t *)0x0;
                  itor_00 = fsg_arciter_next(itor_00)) {
                pfVar10 = fsg_arciter_get(itor_00);
                if ((pfVar10->wid != -1) &&
                   (ppVar12 = ppVar7->nodes, ppVar12 != (ps_latnode_t *)0x0)) {
                  do {
                    if (((ppVar12->sf == iVar20) && (ppVar12->wid == pfVar10->wid)) &&
                       (ppVar12->node_id == pfVar10->to_state)) {
                      ps_lattice_link(ppVar7,ppVar13,ppVar12,local_4c,pfVar8->frame);
                      break;
                    }
                    ppVar12 = ppVar12->next;
                  } while (ppVar12 != (ps_latnode_s *)0x0);
                }
              }
            }
            else {
              for (ppVar12 = ppVar7->nodes; ppVar12 != (ps_latnode_t *)0x0; ppVar12 = ppVar12->next)
              {
                if (((ppVar12->sf == iVar20) && (ppVar12->wid == pfVar10->wid)) &&
                   (ppVar12->node_id == pfVar10->to_state)) {
                  ps_lattice_link(ppVar7,ppVar13,ppVar12,local_4c,pfVar8->frame);
                  break;
                }
              }
            }
            itor = fsg_arciter_next(itor);
          } while (itor != (fsg_arciter_t *)0x0);
        }
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar5);
  }
  ppVar13 = ppVar7->nodes;
  if (ppVar13 == (ps_latnode_t *)0x0) {
    pgVar11 = (glist_t)0x0;
    ppVar24 = search;
LAB_0012a65c:
    search = ppVar24;
    iVar17 = fsg_model_word_add((fsg_model_t *)ppVar24[1].type,"<s>");
    if (*(long *)(ppVar24[1].type + 0x20) != 0) {
      iVar20 = iVar17 + 0x1f;
      if (-1 < iVar17) {
        iVar20 = iVar17;
      }
      puVar1 = (uint *)(*(long *)(ppVar24[1].type + 0x20) + (long)(iVar20 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)iVar17 & 0x1f);
    }
    ppVar13 = new_node(ppVar7,(fsg_model_t *)0x0,0,iVar17,-1,0,(int32)search);
    pgVar21 = pgVar11;
    if (pgVar11 == (glist_t)0x0) {
      pgVar11 = (glist_t)0x0;
    }
    else {
      do {
        ps_lattice_link(ppVar7,ppVar13,(ps_latnode_t *)(pgVar21->data).ptr,0,0);
        ppgVar2 = &pgVar21->next;
        pgVar21 = *ppgVar2;
      } while (*ppgVar2 != (gnode_s *)0x0);
    }
  }
  else {
    iVar17 = 0;
    pgVar11 = (glist_t)0x0;
    do {
      if ((ppVar13->sf == 0) && (ppVar13->exits != (latlink_list_t *)0x0)) {
        pcVar18 = "(NULL)";
        if ((long)ppVar13->wid != -1) {
          pcVar18 = *(char **)(*(long *)(search[1].type + 0x18) + (long)ppVar13->wid * 8);
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                ,0x4f3,"Start node candidate %s.%d:%d:%d\n",pcVar18,0,(ulong)(uint)ppVar13->fef,
                (ulong)(uint)ppVar13->lef);
        pgVar11 = glist_add_ptr(pgVar11,ppVar13);
        iVar17 = iVar17 + 1;
      }
      ppVar13 = ppVar13->next;
    } while (ppVar13 != (ps_latnode_s *)0x0);
    ppVar24 = search;
    if (iVar17 != 1) goto LAB_0012a65c;
    ppVar13 = (ps_latnode_t *)(pgVar11->data).ptr;
  }
  glist_free(pgVar11);
  ppVar7->start = ppVar13;
  if (ppVar13 == (ps_latnode_t *)0x0) {
    pcVar18 = "Failed to find the start node\n";
    lVar15 = 0x5f0;
LAB_0012a8e0:
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
            ,lVar15,pcVar18);
    ps_lattice_free(ppVar7);
    ppVar7 = (ps_lattice_t *)0x0;
  }
  else {
    ppVar13 = ppVar7->nodes;
    if (ppVar13 == (ps_latnode_t *)0x0) {
      pgVar11 = (glist_t)0x0;
      goto LAB_0012a80c;
    }
    pgVar11 = (glist_t)0x0;
    iVar17 = 0;
    do {
      if ((ppVar13->lef == ppVar7->n_frames - 1U) && (ppVar13->entries != (latlink_list_t *)0x0)) {
        pcVar18 = "(NULL)";
        if ((long)ppVar13->wid != -1) {
          pcVar18 = *(char **)(*(long *)(search[1].type + 0x18) + (long)ppVar13->wid * 8);
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                ,0x51a,"End node candidate %s.%d:%d:%d (%d)\n",pcVar18,(ulong)(uint)ppVar13->sf,
                (ulong)(uint)ppVar13->fef,(ulong)(uint)ppVar13->lef,
                (ulong)(uint)(ppVar13->info).fanin);
        pgVar11 = glist_add_ptr(pgVar11,ppVar13);
        iVar17 = iVar17 + 1;
      }
      ppVar13 = ppVar13->next;
    } while (ppVar13 != (ps_latnode_s *)0x0);
    if (iVar17 == 1) {
      ppVar13 = (ps_latnode_t *)(pgVar11->data).i;
LAB_0012a8b0:
      glist_free(pgVar11);
      ppVar7->end = ppVar13;
      if (ppVar13 == (ps_latnode_t *)0x0) {
LAB_0012a8cd:
        pcVar18 = "Failed to find the end node\n";
        lVar15 = 0x5f4;
        goto LAB_0012a8e0;
      }
    }
    else {
      if (iVar17 != 0) {
        ppVar24 = search;
        iVar17 = fsg_model_word_add((fsg_model_t *)search[1].type,"</s>");
        if (*(long *)(search[1].type + 0x20) != 0) {
          iVar20 = iVar17 + 0x1f;
          if (-1 < iVar17) {
            iVar20 = iVar17;
          }
          puVar1 = (uint *)(*(long *)(search[1].type + 0x20) + (long)(iVar20 >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)iVar17 & 0x1f);
        }
        ppVar13 = new_node(ppVar7,(fsg_model_t *)(ulong)(uint)search[1].post,search[1].post,iVar17,
                           -1,0,(int32)ppVar24);
        pgVar21 = pgVar11;
        if (pgVar11 == (glist_t)0x0) {
          pgVar11 = (glist_t)0x0;
        }
        else {
          do {
            ps_lattice_link(ppVar7,(ps_latnode_t *)(pgVar21->data).ptr,ppVar13,
                            (((ps_latnode_t *)(pgVar21->data).ptr)->info).fanin,search[1].post);
            ppgVar2 = &pgVar21->next;
            pgVar21 = *ppgVar2;
          } while (*ppgVar2 != (gnode_s *)0x0);
        }
        goto LAB_0012a8b0;
      }
      ppVar12 = ppVar7->nodes;
      if (ppVar12 == (ps_latnode_t *)0x0) {
LAB_0012a80c:
        glist_free(pgVar11);
        ppVar7->end = (ps_latnode_t *)0x0;
        goto LAB_0012a8cd;
      }
      iVar17 = 0;
      ppVar13 = (ps_latnode_t *)0x0;
      do {
        if ((iVar17 < ppVar12->lef) && (ppVar12->entries != (latlink_list_t *)0x0)) {
          ppVar13 = ppVar12;
          iVar17 = ppVar12->lef;
        }
        ppVar12 = ppVar12->next;
      } while (ppVar12 != (ps_latnode_s *)0x0);
      if (ppVar13 == (ps_latnode_t *)0x0) goto LAB_0012a80c;
      if ((long)ppVar13->wid == -1) {
        pcVar18 = "(NULL)";
      }
      else {
        pcVar18 = *(char **)(*(long *)(search[1].type + 0x18) + (long)ppVar13->wid * 8);
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
              ,0x533,"End node %s.%d:%d:%d (%d)\n",pcVar18,(ulong)(uint)ppVar13->sf,
              (ulong)(uint)ppVar13->fef,(ulong)(uint)ppVar13->lef,(ulong)(uint)(ppVar13->info).fanin
             );
      glist_free(pgVar11);
      ppVar7->end = ppVar13;
    }
    lVar15 = (long)ppVar7->start->wid;
    pcVar19 = "(NULL)";
    pcVar18 = "(NULL)";
    if (lVar15 != -1) {
      pcVar18 = fsg->vocab[lVar15];
    }
    if ((long)ppVar13->wid != -1) {
      pcVar19 = fsg->vocab[ppVar13->wid];
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
            ,0x5fb,"lattice start node %s.%d end node %s.%d\n",pcVar18,
            (ulong)(uint)ppVar7->start->sf,pcVar19,(ulong)(uint)ppVar13->sf);
    ppVar13 = ppVar7->nodes;
    if (ppVar13 != (ps_latnode_t *)0x0) {
      d = ppVar7->search->dict;
      do {
        pcVar18 = "(NULL)";
        if ((long)ppVar13->wid != -1) {
          pcVar18 = fsg->vocab[ppVar13->wid];
        }
        sVar6 = dict_wordid(d,pcVar18);
        ppVar13->wid = sVar6;
        d = ppVar7->search->dict;
        ppVar13->basewid = d->word[sVar6].basewid;
        ppVar13 = ppVar13->next;
      } while (ppVar13 != (ps_latnode_s *)0x0);
    }
    ppVar13 = ppVar7->end;
    ppVar13->reachable = 1;
    gn = glist_add_ptr((glist_t)0x0,ppVar13);
    while (gn != (gnode_t *)0x0) {
      lVar15 = (gn->data).i;
      gn = gnode_free(gn,(gnode_t *)0x0);
      for (puVar22 = *(undefined8 **)(lVar15 + 0x30); puVar22 != (undefined8 *)0x0;
          puVar22 = (undefined8 *)puVar22[1]) {
        ptr = *(void **)*puVar22;
        if (*(short *)((long)ptr + 0x18) == 0) {
          *(undefined2 *)((long)ptr + 0x18) = 1;
          gn = glist_add_ptr(gn,ptr);
        }
      }
    }
    ps_lattice_delete_unreachable(ppVar7);
    plVar4 = fsg->lmath;
    dVar23 = ps_config_float(search->config,"silprob");
    iVar17 = logmath_log(plVar4,(float64)dVar23);
    fVar3 = (float)fsg->lw;
    plVar4 = fsg->lmath;
    dVar23 = ps_config_float(search->config,"fillprob");
    iVar20 = logmath_log(plVar4,(float64)dVar23);
    ps_lattice_penalize_fillers
              (ppVar7,(int)((float)iVar17 * fVar3) >> 10,(int)((float)iVar20 * (float)fsg->lw) >> 10
              );
    search->dag = ppVar7;
  }
  return ppVar7;
}

Assistant:

static ps_lattice_t *
fsg_search_lattice(ps_search_t *search)
{
    fsg_search_t *fsgs;
    fsg_model_t *fsg;
    ps_latnode_t *node;
    ps_lattice_t *dag;
    int32 i, n;

    fsgs = (fsg_search_t *)search;

    /* Check to see if a lattice has previously been created over the
     * same number of frames, and reuse it if so. */
    if (search->dag && search->dag->n_frames == fsgs->frame)
        return search->dag;

    /* Nope, create a new one. */
    ps_lattice_free(search->dag);
    search->dag = NULL;
    dag = ps_lattice_init_search(search, fsgs->frame);
    fsg = fsgs->fsg;

    /*
     * Each history table entry represents a link in the word graph.
     * The set of nodes is determined by the number of unique
     * (word,start-frame) pairs in the history table.  So we will
     * first find all those nodes.
     */
    n = fsg_history_n_entries(fsgs->history);
    for (i = 0; i < n; ++i) {
        fsg_hist_entry_t *fh = fsg_history_entry_get(fsgs->history, i);
        int32 ascr;
        int sf;

        /* Skip null transitions. */
        if (fh->fsglink == NULL || fh->fsglink->wid == -1)
            continue;

        /* Find the start node of this link. */
        if (fh->pred) {
            fsg_hist_entry_t *pfh = fsg_history_entry_get(fsgs->history, fh->pred);
            /* FIXME: We include the transition score in the lattice
             * link score.  This is because of the practical
             * difficulty of obtaining it separately in bestpath or
             * forward-backward search, and because it is essentially
             * a unigram probability, so there is no need to treat it
             * separately from the acoustic score.  However, it's not
             * clear that this will actually yield correct results.*/
            ascr = fh->score - pfh->score;
            sf = pfh->frame + 1;
        }
        else {
            ascr = fh->score;
            sf = 0;
        }

        /*
         * Note that although scores are tied to links rather than
         * nodes, it's possible that there are no links out of the
         * destination node, and thus we need to preserve its score in
         * case it turns out to be utterance-final.
         */
        new_node(dag, fsg, sf, fh->frame, fh->fsglink->wid, fsg_link_to_state(fh->fsglink), ascr);
    }

    /*
     * Now, we will create links only to nodes that actually exist.
     */
    n = fsg_history_n_entries(fsgs->history);
    for (i = 0; i < n; ++i) {
        fsg_hist_entry_t *fh = fsg_history_entry_get(fsgs->history, i);
        fsg_arciter_t *itor;
        ps_latnode_t *src, *dest;
        int32 ascr;
        int sf;

        /* Skip null transitions. */
        if (fh->fsglink == NULL || fh->fsglink->wid == -1)
            continue;

        /* Find the start node of this link and calculate its link score. */
        if (fh->pred) {
            fsg_hist_entry_t *pfh = fsg_history_entry_get(fsgs->history, fh->pred);
            sf = pfh->frame + 1;
            ascr = fh->score - pfh->score;
        }
        else {
            ascr = fh->score;
            sf = 0;
        }
        src = find_node(dag, fsg, sf, fh->fsglink->wid, fsg_link_to_state(fh->fsglink));
        sf = fh->frame + 1;

        for (itor = fsg_model_arcs(fsg, fsg_link_to_state(fh->fsglink));
             itor; itor = fsg_arciter_next(itor)) {
            fsg_link_t *link = fsg_arciter_get(itor);
            
            /* FIXME: Need to figure out what to do about tag transitions. */
            if (link->wid >= 0) {
                /*
                 * For each non-epsilon link following this one, look for a
                 * matching node in the lattice and link to it.
                 */
                if ((dest = find_node(dag, fsg, sf, link->wid, fsg_link_to_state(link))) != NULL)
            	    ps_lattice_link(dag, src, dest, ascr, fh->frame);
            }
            else {
                /*
                 * Transitive closure on nulls has already been done, so we
                 * just need to look one link forward from them.
                 */
                fsg_arciter_t *itor2;
                
                /* Add all non-null links out of j. */
                for (itor2 = fsg_model_arcs(fsg, fsg_link_to_state(link));
                     itor2; itor2 = fsg_arciter_next(itor2)) {
                    fsg_link_t *link = fsg_arciter_get(itor2);

                    if (link->wid == -1)
                        continue;
                    
                    if ((dest = find_node(dag, fsg, sf, link->wid, fsg_link_to_state(link))) != NULL) {
                        ps_lattice_link(dag, src, dest, ascr, fh->frame);
                    }
                }
            }
        }
    }


    /* Figure out which nodes are the start and end nodes. */
    if ((dag->start = find_start_node(fsgs, dag)) == NULL) {
	E_WARN("Failed to find the start node\n");
        goto error_out;
    }
    if ((dag->end = find_end_node(fsgs, dag)) == NULL) {
	E_WARN("Failed to find the end node\n");
        goto error_out;
    }


    E_INFO("lattice start node %s.%d end node %s.%d\n",
           fsg_model_word_str(fsg, dag->start->wid), dag->start->sf,
           fsg_model_word_str(fsg, dag->end->wid), dag->end->sf);
    /* FIXME: Need to calculate final_node_ascr here. */

    /*
     * Convert word IDs from FSG to dictionary.
     */
    for (node = dag->nodes; node; node = node->next) {
        node->wid = dict_wordid(dag->search->dict,
                                fsg_model_word_str(fsg, node->wid));
        node->basewid = dict_basewid(dag->search->dict, node->wid);
    }

    /*
     * Now we are done, because the links in the graph are uniquely
     * defined by the history table.  However we should remove any
     * nodes which are not reachable from the end node of the FSG.
     * Everything is reachable from the start node by definition.
     */
    mark_reachable(dag, dag->end);

    ps_lattice_delete_unreachable(dag);
    {
        int32 silpen, fillpen;

        silpen = (int32)(logmath_log(fsg->lmath,
                                     ps_config_float(ps_search_config(fsgs), "silprob"))
                         * fsg->lw)
            >> SENSCR_SHIFT;
        fillpen = (int32)(logmath_log(fsg->lmath,
                                      ps_config_float(ps_search_config(fsgs), "fillprob"))
                          * fsg->lw)
            >> SENSCR_SHIFT;
	
	ps_lattice_penalize_fillers(dag, silpen, fillpen);
    }
    search->dag = dag;

    return dag;


error_out:
    ps_lattice_free(dag);
    return NULL;

}